

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O0

void __thiscall DCeiling::Tick(DCeiling *this)

{
  int iVar1;
  ECeiling EVar2;
  bool bVar3;
  EMoveResult EVar4;
  EMoveResult res;
  DCeiling *this_local;
  
  iVar1 = this->m_Direction;
  if (iVar1 == -1) {
    EVar4 = sector_t::MoveCeiling
                      ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                       this->m_Speed,this->m_BottomHeight,this->m_Crush,this->m_Direction,
                       this->m_CrushMode == crushHexen);
    if (EVar4 == pastdest) {
      switch(this->m_Type) {
      case ceilCrushAndRaise:
      case ceilCrushRaiseAndStay:
        goto switchD_0062fd1d_caseD_6;
      case genCeilingChg0:
      case genCeilingChgT:
        sector_t::SetSpecial
                  ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                   &this->m_NewSpecial);
      case genCeilingChg:
        sector_t::SetTexture
                  ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,1,
                   (FTextureID)(this->m_Texture).texnum,true);
      default:
        SN_StopSequence((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2);
        (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject
          ._vptr_DObject[4])();
        return;
      }
    }
    if (EVar4 != crushed) {
      return;
    }
    if (this->m_Type != ceilCrushAndRaise && this->m_Type != ceilLowerAndCrush) {
      return;
    }
    if (this->m_CrushMode != crushSlowdown) {
      return;
    }
    this->m_Speed = 0.125;
    return;
  }
  if (iVar1 == 0) {
    return;
  }
  if (iVar1 != 1) {
    return;
  }
  EVar4 = sector_t::MoveCeiling
                    ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                     this->m_Speed,this->m_TopHeight,this->m_Direction);
  if (EVar4 != pastdest) {
    return;
  }
  EVar2 = this->m_Type;
  if (EVar2 == ceilCrushAndRaise) {
    this->m_Direction = -1;
    this->m_Speed = this->m_Speed1;
    bVar3 = SN_IsMakingLoopingSound
                      ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector);
    if (bVar3) {
      return;
    }
    PlayCeilingSound(this);
    return;
  }
  if (EVar2 - genCeilingChg0 < 2) {
    sector_t::SetSpecial
              ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
               &this->m_NewSpecial);
  }
  else if (EVar2 != genCeilingChg) goto LAB_0062fc99;
  sector_t::SetTexture
            ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,1,
             (FTextureID)(this->m_Texture).texnum,true);
LAB_0062fc99:
  SN_StopSequence((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2);
  (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
    _vptr_DObject[4])();
  return;
switchD_0062fd1d_caseD_6:
  this->m_Speed = this->m_Speed2;
  this->m_Direction = 1;
  bVar3 = SN_IsMakingLoopingSound
                    ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector);
  if (bVar3) {
    return;
  }
  PlayCeilingSound(this);
  return;
}

Assistant:

void DCeiling::Tick ()
{
	EMoveResult res;
		
	switch (m_Direction)
	{
	case 0:
		// IN STASIS
		break;
	case 1:
		// UP
		res = m_Sector->MoveCeiling (m_Speed, m_TopHeight, m_Direction);
		
		if (res == EMoveResult::pastdest)
		{
			switch (m_Type)
			{
			case DCeiling::ceilCrushAndRaise:
				m_Direction = -1;
				m_Speed = m_Speed1;
				if (!SN_IsMakingLoopingSound (m_Sector))
					PlayCeilingSound ();
				break;
				
			// movers with texture change, change the texture then get removed
			case genCeilingChgT:
			case genCeilingChg0:
				m_Sector->SetSpecial(&m_NewSpecial);
				// fall through
			case genCeilingChg:
				m_Sector->SetTexture(sector_t::ceiling, m_Texture);
				// fall through
			default:
				SN_StopSequence (m_Sector, CHAN_CEILING);
				Destroy ();
				break;
			}
		}
		break;
		
	case -1:
		// DOWN
		res = m_Sector->MoveCeiling (m_Speed, m_BottomHeight, m_Crush, m_Direction, m_CrushMode == ECrushMode::crushHexen);
		
		if (res == EMoveResult::pastdest)
		{
			switch (m_Type)
			{
			case DCeiling::ceilCrushAndRaise:
			case DCeiling::ceilCrushRaiseAndStay:
				m_Speed = m_Speed2;
				m_Direction = 1;
				if (!SN_IsMakingLoopingSound (m_Sector))
					PlayCeilingSound ();
				break;

			// in the case of ceiling mover/changer, change the texture
			// then remove the active ceiling
			case genCeilingChgT:
			case genCeilingChg0:
				m_Sector->SetSpecial(&m_NewSpecial);
				// fall through
			case genCeilingChg:
				m_Sector->SetTexture(sector_t::ceiling, m_Texture);
				// fall through
			default:
				SN_StopSequence (m_Sector, CHAN_CEILING);
				Destroy ();
				break;
			}
		}
		else // ( res != pastdest )
		{
			if (res == EMoveResult::crushed)
			{
				switch (m_Type)
				{
				case DCeiling::ceilCrushAndRaise:
				case DCeiling::ceilLowerAndCrush:
					if (m_CrushMode == ECrushMode::crushSlowdown)
						m_Speed = 1. / 8;
						break;

				default:
					break;
				}
			}
		}
		break;
	}
}